

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O0

bool __thiscall COLLADASaxFWL::MeshLoader::initializeTexCoordsOffset(MeshLoader *this)

{
  InputShared *this_00;
  InputSharedArray *this_01;
  size_t sVar1;
  InputShared **ppIVar2;
  Semantic *pSVar3;
  URI *this_02;
  String *pSVar4;
  SourceBase *this_03;
  value_type *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool bVar5;
  PrimitiveInput texCoord;
  size_t indexOffset;
  size_t intitialIndex;
  size_t stride;
  SourceBase *sourceBase;
  String sourceId;
  InputShared *input;
  size_t i;
  size_t numInputs;
  InputSharedArray *inputArray;
  String *in_stack_fffffffffffffee0;
  SourceArrayLoader *in_stack_fffffffffffffee8;
  string *this_04;
  string local_e8 [32];
  value_type *local_c8;
  SourceArrayLoader *local_c0;
  unsigned_long_long local_b8;
  ulong local_b0;
  ulong local_a8;
  String *local_a0;
  SourceArrayLoader *local_98;
  uint local_90;
  allocator<char> local_89;
  string local_88 [36];
  Severity in_stack_ffffffffffffff9c;
  String *in_stack_ffffffffffffffa0;
  SourceBase *pSVar6;
  IFilePartLoader *in_stack_ffffffffffffffb0;
  ulong local_28;
  byte local_1;
  ErrorType errorType;
  
  this_01 = MeshPrimitiveInputList::getInputArray((MeshPrimitiveInputList *)&in_RDI[10].field_2);
  sVar1 = COLLADAFW::ArrayPrimitiveType<COLLADASaxFWL::InputShared_*>::getCount(this_01);
  for (local_28 = 0; local_28 < sVar1; local_28 = local_28 + 1) {
    ppIVar2 = COLLADAFW::ArrayPrimitiveType<COLLADASaxFWL::InputShared_*>::operator[]
                        (this_01,local_28);
    this_00 = *ppIVar2;
    pSVar3 = InputUnshared::getSemantic(&this_00->super_InputUnshared);
    if (*pSVar3 == TEXCOORD) {
      this_02 = InputUnshared::getSource(&this_00->super_InputUnshared);
      pSVar4 = COLLADABU::URI::getFragment_abi_cxx11_(this_02);
      this_04 = (string *)&stack0xffffffffffffffb0;
      std::__cxx11::string::string(this_04,(string *)pSVar4);
      this_03 = SourceArrayLoader::getSourceById
                          (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      bVar5 = this_03 != (SourceBase *)0x0;
      if (bVar5) {
        in_stack_fffffffffffffee8 = (SourceArrayLoader *)SourceBase::getStride(this_03);
        local_98 = in_stack_fffffffffffffee8;
        in_stack_fffffffffffffee0 = (String *)SourceBase::getInitialIndex(this_03);
        local_a8 = (ulong)in_stack_fffffffffffffee0 / (ulong)local_98;
        local_a0 = in_stack_fffffffffffffee0;
        PrimitiveInput::PrimitiveInput((PrimitiveInput *)0xc51937);
        __x = (value_type *)InputShared::getOffset(this_00);
        local_b0 = local_a8;
        local_c0 = local_98;
        local_c8 = __x;
        local_b8 = InputShared::getSet(this_00);
        std::__cxx11::string::operator=(local_e8,(string *)&stack0xffffffffffffffb0);
        std::
        vector<COLLADASaxFWL::MeshLoader::PrimitiveInput,_std::allocator<COLLADASaxFWL::MeshLoader::PrimitiveInput>_>
        ::push_back((vector<COLLADASaxFWL::MeshLoader::PrimitiveInput,_std::allocator<COLLADASaxFWL::MeshLoader::PrimitiveInput>_>
                     *)in_stack_fffffffffffffee0,__x);
        PrimitiveInput::~PrimitiveInput((PrimitiveInput *)0xc519c9);
      }
      else {
        pSVar6 = this_03;
        std::allocator<char>::allocator();
        errorType = (ErrorType)((ulong)pSVar6 >> 0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  (in_RDI,(char *)this_03,(allocator<char> *)this_04);
        local_1 = IFilePartLoader::handleFWLError
                            (in_stack_ffffffffffffffb0,errorType,in_stack_ffffffffffffffa0,
                             in_stack_ffffffffffffff9c);
        std::__cxx11::string::~string(local_88);
        std::allocator<char>::~allocator(&local_89);
      }
      local_90 = (uint)!bVar5;
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
      if (local_90 != 0) goto LAB_00c51a42;
    }
  }
  local_1 = 0;
LAB_00c51a42:
  return (bool)(local_1 & 1);
}

Assistant:

bool MeshLoader::initializeTexCoordsOffset ()
    {
        // Check for using tex coordinates 
        const InputSharedArray& inputArray = mMeshPrimitiveInputs.getInputArray ();
        size_t numInputs = inputArray.getCount ();

        for ( size_t i=0; i<numInputs; ++i )
        {
            const InputShared* input = inputArray [i];
            if ( input->getSemantic () == InputSemantic::TEXCOORD )
            {
                // TODO Id management!
                String sourceId = input->getSource ().getFragment ();
                SourceBase* sourceBase = getSourceById ( sourceId );
                if ( sourceBase == 0 ) 
                {
                    return handleFWLError ( SaxFWLError::ERROR_DATA_NOT_VALID, "SourceBase of tex coords with semantic TEXCOORD not valid!" );
                }

                // only stride 1, 2, 3 or 4 makes sense for uv coords
                size_t stride = ( size_t ) sourceBase->getStride();
                COLLADABU_ASSERT ( (stride >= 1) || (stride <= 4) ); 

                size_t intitialIndex = sourceBase->getInitialIndex ();
                size_t indexOffset = intitialIndex / stride;
 
                PrimitiveInput texCoord;
                texCoord.mOffset = ( size_t ) input->getOffset ();
                texCoord.mInitialIndex = indexOffset;
                texCoord.mStride = stride;
                texCoord.mSetIndex = ( size_t ) input->getSet ();
                texCoord.mName = sourceId;

                mTexCoordList.push_back ( texCoord );
            }
        }
		return false;
    }